

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O1

void __thiscall argvParser::printHelpMessage(argvParser *this,bool colored)

{
  pointer pcVar1;
  vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
  *pvVar2;
  section *__rhs;
  argument *paVar3;
  bool bVar4;
  pointer ppsVar5;
  long *plVar6;
  pointer ppaVar7;
  ostream *poVar8;
  size_type *psVar9;
  char cVar10;
  int iVar11;
  undefined7 in_register_00000031;
  ulong uVar12;
  string requiredArgs;
  string s;
  char *local_180;
  long local_178;
  char local_170 [16];
  string local_160;
  int local_13c;
  char *local_138;
  long local_130;
  char local_128 [16];
  ulong local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar11 = (int)CONCAT71(in_register_00000031,colored);
  local_138 = local_128;
  local_130 = 0;
  local_128[0] = '\0';
  if (iVar11 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1;32m",7);
  }
  local_180 = local_170;
  pcVar1 = (this->super_argParserAdvancedConfiguration).applicationName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar1,
             pcVar1 + (this->super_argParserAdvancedConfiguration).applicationName._M_string_length)
  ;
  std::__cxx11::string::append((char *)&local_180);
  std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_180);
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  local_180 = local_170;
  pcVar1 = (this->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,pcVar1,pcVar1 + (this->description)._M_string_length);
  std::__cxx11::string::append((char *)&local_180);
  local_13c = iVar11;
  std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_180);
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  local_180 = local_170;
  local_178 = 0;
  local_170[0] = '\0';
  pvVar2 = (this->super_argParserAdvancedConfiguration).newargconfig;
  ppsVar5 = (pvVar2->
            super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar2->
      super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppsVar5) {
    uVar12 = 0;
    do {
      __rhs = ppsVar5[uVar12];
      if ((__rhs->sectionName)._M_string_length != 0) {
        std::operator+(&local_50,"\n ",&__rhs->sectionName);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar9 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_160.field_2._M_allocated_capacity = *psVar9;
          local_160.field_2._8_8_ = plVar6[3];
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar9;
          local_160._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_160._M_string_length = plVar6[1];
        *plVar6 = (long)psVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_160._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      ppaVar7 = (__rhs->arguments->
                super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_118 = uVar12;
      if ((__rhs->arguments->
          super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppaVar7) {
        uVar12 = 0;
        do {
          paVar3 = ppaVar7[uVar12];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          pcVar1 = (paVar3->argShort)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar1,pcVar1 + (paVar3->argShort)._M_string_length);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          pcVar1 = (paVar3->argLong)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar1,pcVar1 + (paVar3->argLong)._M_string_length);
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          pcVar1 = (paVar3->helpMessage)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar1,pcVar1 + (paVar3->helpMessage)._M_string_length);
          argParserAdvancedConfiguration::buildHelpLine
                    (&local_160,&this->super_argParserAdvancedConfiguration,&local_d0,&local_70,
                     &local_90);
          std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_160._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if (paVar3->requiredAndNotHitJet == true) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar1 = (paVar3->argShort)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar1,pcVar1 + (paVar3->argShort)._M_string_length);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            pcVar1 = (paVar3->argLong)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,pcVar1,pcVar1 + (paVar3->argLong)._M_string_length);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            pcVar1 = (paVar3->helpMessage)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,pcVar1,pcVar1 + (paVar3->helpMessage)._M_string_length);
            argParserAdvancedConfiguration::buildHelpLine
                      (&local_160,&this->super_argParserAdvancedConfiguration,&local_f0,&local_110,
                       &local_b0);
            std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_160._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
          }
          uVar12 = uVar12 + 1;
          ppaVar7 = (__rhs->arguments->
                    super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar12 < (ulong)((long)(__rhs->arguments->
                                        super__Vector_base<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppaVar7
                                 >> 3));
      }
      uVar12 = local_118 + 1;
      pvVar2 = (this->super_argParserAdvancedConfiguration).newargconfig;
      ppsVar5 = (pvVar2->
                super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(pvVar2->
                                    super__Vector_base<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar5 >> 3
                             ));
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_138,local_130);
  iVar11 = local_13c;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  bVar4 = foundAllRequierdArgs(this);
  cVar10 = (char)iVar11;
  if (!bVar4) {
    if (cVar10 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1;31m",7);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nrequired arguments are : \n",0x1b);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_180,local_178);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if (cVar10 == '\0') goto LAB_001057e5;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0;0m",6);
  }
  if (cVar10 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1;31m",7);
  }
LAB_001057e5:
  if ((this->super_argParserAdvancedConfiguration).lastFailedArg._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"failed argument : \"",0x13);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (this->super_argParserAdvancedConfiguration).lastFailedArg._M_dataplus._M_p,
                        (this->super_argParserAdvancedConfiguration).lastFailedArg._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
  }
  if ((this->super_argParserAdvancedConfiguration).errorMessage._M_string_length != 0) {
    std::operator+(&local_160," ",&(this->super_argParserAdvancedConfiguration).errorMessage);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_160._M_dataplus._M_p,local_160._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p);
    }
  }
  if (cVar10 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0;0m",6);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  plVar6 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  if (local_180 != local_170) {
    operator_delete(local_180);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  return;
}

Assistant:

void argvParser::printHelpMessage(bool colored) {
    string s;
    if (colored)
        printGreen();
    s += applicationName + "\n";
    s += description + "\nUsage:\n";
    string requiredArgs;
    for(int secIndex = 0; secIndex < newargconfig->size();secIndex++ ){
        section *sec = newargconfig->at(secIndex);
        if(!sec->sectionName.empty()){
            s+= "\n " + sec->sectionName + ": \n";
        }
        for(int argIndex = 0; argIndex<sec->arguments->size();argIndex++){
            argument * arg = sec->arguments->at(argIndex);
            s += buildHelpLine(arg->argShort,arg->argLong,arg->helpMessage);
            if(arg->requiredAndNotHitJet)
                requiredArgs += buildHelpLine(arg->argShort, arg->argLong, arg->helpMessage);
        }
    }
    cout << s<<endl;
    if (!foundAllRequierdArgs()) {
        if (colored)
            printRed();
        cout << "\nrequired arguments are : \n" << requiredArgs << endl;
        if (colored)
            resetCLI();
    }
    if (colored)
        printRed();
    if (!lastFailedArg.empty())
        cout << "failed argument : \"" << lastFailedArg << "\"";

    if (!errorMessage.empty())
        cout << " " + errorMessage;
    if (colored)
        resetCLI();

    cout << endl << endl;

}